

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_status dump_int_array_binary(nbt_int_array ia,buffer *b)

{
  int iVar1;
  undefined4 local_34;
  int local_30;
  int32_t swappedElem;
  int32_t i;
  int32_t dumped_length;
  buffer *b_local;
  nbt_int_array ia_local;
  
  b_local = (buffer *)ia.data;
  swappedElem = ia.length;
  _i = b;
  ia_local.data._0_4_ = swappedElem;
  be2ne(&swappedElem,4);
  iVar1 = buffer_append(_i,&swappedElem,4);
  if (iVar1 == 0) {
    if (((int32_t)ia_local.data != 0) && (b_local == (buffer *)0x0)) {
      __assert_fail("ia.data",
                    "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c"
                    ,0x28f,
                    "nbt_status dump_int_array_binary(const struct nbt_int_array, struct buffer *)")
      ;
    }
    for (local_30 = 0; local_30 < (int32_t)ia_local.data; local_30 = local_30 + 1) {
      local_34 = *(undefined4 *)((long)&b_local->data + (long)local_30 * 4);
      be2ne(&local_34,4);
      iVar1 = buffer_append(_i,&local_34,4);
      if (iVar1 != 0) {
        return NBT_EMEM;
      }
    }
    ia_local._12_4_ = 0;
  }
  else {
    ia_local._12_4_ = 0xfffffffe;
  }
  return ia_local._12_4_;
}

Assistant:

static nbt_status dump_int_array_binary(const struct nbt_int_array ia, struct buffer* b)
{
    int32_t dumped_length = ia.length;

    ne2be(&dumped_length, sizeof dumped_length);

    CHECKED_APPEND(b, &dumped_length, sizeof dumped_length);

    if(ia.length) assert(ia.data);

    for(int32_t i = 0; i < ia.length; i++)
    {
        int32_t swappedElem = ia.data[i];
        ne2be(&swappedElem, sizeof(swappedElem));
        CHECKED_APPEND(b, &swappedElem, sizeof(swappedElem));
    }

    return NBT_OK;
}